

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O1

void leveldb::PutLengthPrefixedSlice(string *dst,Slice *value)

{
  char buf [5];
  char local_1d [5];
  
  EncodeVarint32(local_1d,(uint32_t)value->size_);
  std::__cxx11::string::append((char *)dst,(ulong)local_1d);
  std::__cxx11::string::append((char *)dst,(ulong)value->data_);
  return;
}

Assistant:

void PutLengthPrefixedSlice(std::string* dst, const Slice& value) {
  PutVarint32(dst, value.size());
  dst->append(value.data(), value.size());
}